

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O0

bool __thiscall Kumu::Timestamp::Archive(Timestamp *this,MemIOWriter *Writer)

{
  bool bVar1;
  ui8_t local_27;
  ui8_t local_26;
  ui8_t local_25;
  ui8_t local_24;
  ui8_t local_23;
  ui16_t local_22;
  ui8_t tick;
  ui8_t second;
  ui8_t minute;
  ui8_t hour;
  ui8_t day;
  ui8_t month;
  ui16_t year;
  MemIOWriter *Writer_local;
  Timestamp *this_local;
  
  _tick = Writer;
  Writer_local = (MemIOWriter *)this;
  if (Writer != (MemIOWriter *)0x0) {
    GetComponents(this,&local_22,&local_23,&local_24,&local_25,&local_26,&local_27);
    bVar1 = MemIOWriter::WriteUi16BE(_tick,local_22);
    if (bVar1) {
      bVar1 = MemIOWriter::WriteUi8(_tick,local_23);
      if (bVar1) {
        bVar1 = MemIOWriter::WriteUi8(_tick,local_24);
        if (bVar1) {
          bVar1 = MemIOWriter::WriteUi8(_tick,local_25);
          if (bVar1) {
            bVar1 = MemIOWriter::WriteUi8(_tick,local_26);
            if (bVar1) {
              bVar1 = MemIOWriter::WriteUi8(_tick,local_27);
              if (bVar1) {
                bVar1 = MemIOWriter::WriteUi8(_tick,'\0');
                if (bVar1) {
                  this_local._7_1_ = true;
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  __assert_fail("Writer",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                ,0x3ed,"virtual bool Kumu::Timestamp::Archive(MemIOWriter *) const");
}

Assistant:

bool
Kumu::Timestamp::Archive(MemIOWriter* Writer) const
{
  assert(Writer);

  ui16_t year;
  ui8_t month, day, hour, minute, second, tick = 0;
  GetComponents(year, month, day, hour, minute, second);

  if ( ! Writer->WriteUi16BE(year) ) return false;	
  if ( ! Writer->WriteUi8(month) ) return false;
  if ( ! Writer->WriteUi8(day) ) return false;
  if ( ! Writer->WriteUi8(hour) ) return false;
  if ( ! Writer->WriteUi8(minute) ) return false;
  if ( ! Writer->WriteUi8(second) ) return false;
  if ( ! Writer->WriteUi8(tick) ) return false;
  return true;
}